

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_UInt32 * FT_Face_GetVariantSelectors(FT_Face face)

{
  FT_CharMap pFVar1;
  FT_Memory memory;
  FT_CMap_conflict vcmap;
  FT_CharMap charmap;
  FT_UInt32 *result;
  FT_Face face_local;
  
  charmap = (FT_CharMap)0x0;
  if ((face != (FT_Face)0x0) &&
     (pFVar1 = find_variant_selector_charmap(face), pFVar1 != (FT_CharMap)0x0)) {
    charmap = (FT_CharMap)(**(code **)&(pFVar1[1].face)->num_fixed_sizes)(pFVar1,face->memory);
  }
  return (FT_UInt32 *)charmap;
}

Assistant:

FT_EXPORT_DEF( FT_UInt32* )
  FT_Face_GetVariantSelectors( FT_Face  face )
  {
    FT_UInt32  *result = NULL;


    if ( face )
    {
      FT_CharMap  charmap = find_variant_selector_charmap( face );


      if ( charmap )
      {
        FT_CMap    vcmap  = FT_CMAP( charmap );
        FT_Memory  memory = FT_FACE_MEMORY( face );


        result = vcmap->clazz->variant_list( vcmap, memory );
      }
    }

    return result;
  }